

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_raw.c
# Opt level: O3

int archive_read_format_raw_read_header(archive_read *a,archive_entry *entry)

{
  if (*(int *)((long)a->format->data + 0x10) != 0) {
    return 1;
  }
  (a->archive).archive_format = 0x90000;
  (a->archive).archive_format_name = "raw";
  archive_entry_set_pathname(entry,"data");
  archive_entry_set_filetype(entry,0x8000);
  archive_entry_set_perm(entry,0x1a4);
  return 0;
}

Assistant:

static int
archive_read_format_raw_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct raw_info *info;

	info = (struct raw_info *)(a->format->data);
	if (info->end_of_file)
		return (ARCHIVE_EOF);

	a->archive.archive_format = ARCHIVE_FORMAT_RAW;
	a->archive.archive_format_name = "raw";
	archive_entry_set_pathname(entry, "data");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_perm(entry, 0644);
	/* I'm deliberately leaving most fields unset here. */
	return (ARCHIVE_OK);
}